

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_DerefPostIncrement_Test::TestBody(SCCTest_DerefPostIncrement_Test *this)

{
  bool bVar1;
  SCC *this_00;
  char *message;
  Iterator IVar2;
  AssertHelper local_118;
  Message local_110;
  uint local_104;
  Iterator local_100;
  T local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  undefined1 local_d0 [8];
  Iterator it;
  undefined1 local_b0 [8];
  GraphSCCs sccs;
  Graph_conflict1 graph;
  SCCTest_DerefPostIncrement_Test *this_local;
  
  Graph::Graph((Graph *)&sccs.graph,1);
  GraphSCCs::GraphSCCs((GraphSCCs *)local_b0,(Graph_conflict1 *)&sccs.graph);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::wasm::SCCs<IntIt,_GraphSCCs>::begin((SCCs<IntIt,_GraphSCCs> *)local_b0);
  this_00 = ::wasm::SCCs<IntIt,_GraphSCCs>::Iterator::operator->((Iterator *)&gtest_ar.message_);
  IVar2 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::begin(this_00);
  it.parent = (SCCs<IntIt,_GraphSCCs> *)
              IVar2.val.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>;
  local_d0 = (undefined1  [8])IVar2.parent;
  local_100 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::operator++((Iterator *)local_d0,0);
  local_ec = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::operator*(&local_100);
  local_104 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_e8,"*it++","0u",&local_ec,&local_104);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  GraphSCCs::~GraphSCCs((GraphSCCs *)local_b0);
  Graph::~Graph((Graph *)&sccs.graph);
  return;
}

Assistant:

TEST(SCCTest, DerefPostIncrement) {
  // Valid input iterators must have *it++ yield the value from before the
  // increment.
  Graph graph(1);
  GraphSCCs sccs(graph);
  auto it = sccs.begin()->begin();
  EXPECT_EQ(*it++, 0u);
}